

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void make_iconlabel(Fl_Menu_Item *mi,Fl_Image *ic,char *txt)

{
  size_t sVar1;
  char *__dest;
  Fl_Multi_Label *this;
  Fl_Multi_Label *ml;
  char *t1;
  char *txt_local;
  Fl_Image *ic_local;
  Fl_Menu_Item *mi_local;
  
  if (ic == (Fl_Image *)0x0) {
    if (txt != mi->text) {
      Fl_Menu_Item::label(mi,txt);
    }
  }
  else {
    sVar1 = strlen(txt);
    __dest = (char *)operator_new__(sVar1 + 6);
    strcpy(__dest," ");
    strcat(__dest,txt);
    strcat(__dest,"...");
    Fl_Menu_Item::image(mi,ic);
    this = (Fl_Multi_Label *)operator_new(0x18);
    this->labela = (char *)ic;
    this->labelb = __dest;
    this->typea = '\a';
    this->typeb = '\0';
    Fl_Multi_Label::label(this,mi);
  }
  return;
}

Assistant:

static void make_iconlabel( Fl_Menu_Item *mi, Fl_Image *ic, const char *txt )
{
  if (ic) {
    char *t1 = new char[strlen(txt)+6];
    strcpy( t1, " " );
    strcat(t1, txt);
    strcat(t1, "...");
    mi->image( ic );
    Fl_Multi_Label *ml = new Fl_Multi_Label;
    ml->labela = (char*)ic;
    ml->labelb = t1;
    ml->typea = _FL_IMAGE_LABEL;
    ml->typeb = FL_NORMAL_LABEL;
    ml->label( mi );
  }
  else if (txt!=mi->text)
    mi->label(txt);
}